

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<Fad<double>_>::Decompose_LU(TPZMatrix<Fad<double>_> *this)

{
  long lVar1;
  long lVar2;
  value_type vVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int i;
  uint uVar7;
  double dVar8;
  bool bVar9;
  Fad<double> pivot;
  Fad<double> nn;
  Fad<double> local_130;
  long local_110;
  Fad<double> local_108;
  double local_e8;
  undefined8 uStack_e0;
  long local_d8;
  undefined1 local_d0 [32];
  Fad<double> local_b0;
  Fad<double> local_90;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_70;
  FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_> local_60;
  Fad<double> local_50;
  
  if (1 < (byte)(this->super_TPZBaseMatrix).fDecomposed) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    Fad<double>::Fad(&local_b0);
    Fad<double>::Fad(&local_108);
    local_d8 = (this->super_TPZBaseMatrix).fRow;
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    if (lVar1 < local_d8) {
      local_d8 = lVar1;
    }
    if (0 < local_d8) {
      dVar8 = (double)0;
      do {
        local_110 = (long)dVar8;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_130,this,dVar8);
        local_108.val_ = local_130.val_;
        Vector<double>::operator=(&local_108.dx_,&local_130.dx_);
        iVar4 = local_108.dx_.num_elts;
        local_108.defaultVal = local_130.defaultVal;
        local_90.val_ = local_108.val_;
        local_90.dx_.num_elts = local_108.dx_.num_elts;
        local_90.dx_.ptr_to_data = (double *)0x0;
        if ((long)local_108.dx_.num_elts != 0) {
          uVar6 = (long)local_108.dx_.num_elts * 8;
          if (local_108.dx_.num_elts < 0) {
            uVar6 = 0xffffffffffffffff;
          }
          local_90.dx_.ptr_to_data = (double *)operator_new__(uVar6);
          MEM_CPY<double>::copy
                    ((MEM_CPY<double> *)local_90.dx_.ptr_to_data,
                     (EVP_PKEY_CTX *)local_108.dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)(uint)iVar4);
        }
        local_90.defaultVal = local_108.defaultVal;
        local_e8 = ABS(local_90.val_);
        uStack_e0 = 0;
        Fad<double>::~Fad(&local_90);
        Fad<double>::~Fad(&local_130);
        if (local_e8 < 1e-12) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar5 = local_110 + 1;
        lVar1 = (this->super_TPZBaseMatrix).fRow;
        lVar2 = lVar5 - lVar1;
        bVar9 = SBORROW8(lVar5,lVar1);
        local_e8 = (double)lVar5;
        while (bVar9 != lVar2 < 0) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_130,this,lVar5,local_110);
          local_d0._8_8_ = &local_108;
          local_d0._0_8_ = &local_130;
          Fad<double>::operator=
                    (&local_b0,(FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)local_d0);
          Fad<double>::~Fad(&local_130);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,local_110,&local_b0);
          dVar8 = local_e8;
          if ((long)local_e8 < (this->super_TPZBaseMatrix).fCol) {
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<double> *)local_d0,this,lVar5,dVar8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_50,this,local_110,dVar8);
              local_70.fadexpr_.left_ = &local_b0;
              local_60.right_ = &local_70;
              local_130.val_ = (double)local_d0._0_8_ - local_b0.val_ * local_50.val_;
              uVar7 = local_50.dx_.num_elts;
              if (local_50.dx_.num_elts < local_b0.dx_.num_elts) {
                uVar7 = local_b0.dx_.num_elts;
              }
              if ((int)uVar7 < (int)local_d0._8_4_) {
                uVar7 = local_d0._8_4_;
              }
              local_130.dx_.num_elts = 0;
              local_130.dx_.ptr_to_data = (double *)0x0;
              local_70.fadexpr_.right_ = &local_50;
              local_60.left_ = (Fad<double> *)local_d0;
              if ((int)uVar7 < 1) {
                local_130.defaultVal = 0.0;
              }
              else {
                local_130.dx_.num_elts = uVar7;
                local_130.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar7 * 8);
                local_130.defaultVal = 0.0;
                if (0 < (int)uVar7) {
                  uVar6 = 0;
                  do {
                    vVar3 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                            ::dx(&local_60,(int)uVar6);
                    local_130.dx_.ptr_to_data[uVar6] = vVar3;
                    uVar6 = uVar6 + 1;
                  } while (uVar7 != uVar6);
                }
              }
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,lVar5,dVar8,&local_130);
              Fad<double>::~Fad(&local_130);
              Fad<double>::~Fad(&local_50);
              Fad<double>::~Fad((Fad<double> *)local_d0);
              dVar8 = (double)((long)dVar8 + 1);
            } while ((long)dVar8 < (this->super_TPZBaseMatrix).fCol);
          }
          lVar5 = lVar5 + 1;
          lVar1 = (this->super_TPZBaseMatrix).fRow;
          lVar2 = lVar5 - lVar1;
          bVar9 = SBORROW8(lVar5,lVar1);
        }
        dVar8 = local_e8;
      } while (local_e8 != (double)local_d8);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
    Fad<double>::~Fad(&local_108);
    Fad<double>::~Fad(&local_b0);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}